

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O3

void Abc_NtkAddDummyBoxNames(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  long *plVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  Vec_Ptr_t *pVVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  char PrefLo [100];
  char PrefLi [100];
  undefined2 local_108 [56];
  undefined2 local_98 [52];
  
  pVVar7 = pNtk->vPis;
  if (pVVar7->nSize < 1) {
    uVar11 = 0;
  }
  else {
    lVar12 = 0;
    uVar8 = 0;
    do {
      pcVar6 = Nm_ManCreateUniqueName
                         (*(Nm_Man_t **)(*pVVar7->pArray[lVar12] + 0x18),
                          (int)*(long *)((long)pVVar7->pArray[lVar12] + 0x10));
      uVar10 = 0;
      if (*pcVar6 == 'l') {
        uVar10 = 0;
        do {
          lVar4 = uVar10 + 1;
          uVar10 = uVar10 + 1;
        } while (pcVar6[lVar4] == 'l');
      }
      uVar11 = uVar10 & 0xffffffff;
      if ((int)uVar10 < (int)uVar8) {
        uVar11 = (ulong)uVar8;
      }
      lVar12 = lVar12 + 1;
      pVVar7 = pNtk->vPis;
      uVar8 = (uint)uVar11;
    } while (lVar12 < pVVar7->nSize);
  }
  iVar9 = (int)uVar11;
  pVVar7 = pNtk->vPos;
  if (0 < pVVar7->nSize) {
    lVar12 = 0;
    do {
      pcVar6 = Nm_ManCreateUniqueName
                         (*(Nm_Man_t **)(*pVVar7->pArray[lVar12] + 0x18),
                          (int)*(long *)((long)pVVar7->pArray[lVar12] + 0x10));
      uVar10 = 0;
      if (*pcVar6 == 'l') {
        uVar10 = 0;
        do {
          lVar4 = uVar10 + 1;
          uVar10 = uVar10 + 1;
        } while (pcVar6[lVar4] == 'l');
      }
      if ((int)uVar11 <= (int)uVar10) {
        uVar11 = uVar10 & 0xffffffff;
      }
      iVar9 = (int)uVar11;
      lVar12 = lVar12 + 1;
      pVVar7 = pNtk->vPos;
    } while (lVar12 < pVVar7->nSize);
  }
  if (0x61 < iVar9) {
    __assert_fail("CountMax < 100-2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                  ,0x22f,"void Abc_NtkAddDummyBoxNames(Abc_Ntk_t *)");
  }
  if (iVar9 < 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = (ulong)(iVar9 + 1);
    memset(local_108,0x6c,uVar11);
    memset(local_98,0x6c,uVar11);
  }
  *(undefined2 *)((long)local_98 + uVar11) = 0x69;
  *(undefined2 *)((long)local_108 + uVar11) = 0x6f;
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                  ,0x237,"void Abc_NtkAddDummyBoxNames(Abc_Ntk_t *)");
  }
  uVar8 = pNtk->nObjCounts[8];
  if (1 < uVar8) {
    uVar5 = uVar8 - 1;
    uVar8 = 0;
    do {
      uVar8 = uVar8 + 1;
      bVar3 = 9 < uVar5;
      uVar5 = uVar5 / 10;
    } while (bVar3);
  }
  pVVar7 = pNtk->vBoxes;
  if (0 < pVVar7->nSize) {
    lVar12 = 0;
    do {
      plVar1 = (long *)pVVar7->pArray[lVar12];
      if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
        sprintf(Abc_ObjNameDummy::Buffer,"%s%0*d","l",(ulong)uVar8);
        Nm_ManStoreIdName(*(Nm_Man_t **)(*plVar1 + 0x18),(int)plVar1[2],
                          *(uint *)((long)plVar1 + 0x14) & 0xf,Abc_ObjNameDummy::Buffer,(char *)0x0)
        ;
        plVar2 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
        sprintf(Abc_ObjNameDummy::Buffer,"%s%0*d",local_98,(ulong)uVar8);
        Nm_ManStoreIdName(*(Nm_Man_t **)(*plVar2 + 0x18),(int)plVar2[2],
                          *(uint *)((long)plVar2 + 0x14) & 0xf,Abc_ObjNameDummy::Buffer,(char *)0x0)
        ;
        plVar1 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8);
        sprintf(Abc_ObjNameDummy::Buffer,"%s%0*d",local_108,(ulong)uVar8);
        Nm_ManStoreIdName(*(Nm_Man_t **)(*plVar1 + 0x18),(int)plVar1[2],
                          *(uint *)((long)plVar1 + 0x14) & 0xf,Abc_ObjNameDummy::Buffer,(char *)0x0)
        ;
        pVVar7 = pNtk->vBoxes;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar7->nSize);
  }
  return;
}

Assistant:

void Abc_NtkAddDummyBoxNames( Abc_Ntk_t * pNtk )
{
    char * pName, PrefLi[100], PrefLo[100];
    Abc_Obj_t * pObj;
    int nDigits, i, k, CountCur, CountMax = 0;
    // if PIs/POs already have nodes with what looks like latch names
    // we need to add different prefix for the new latches
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        CountCur = 0;
        pName = Abc_ObjName(pObj);
        for ( k = 0; pName[k]; k++ )
            if ( pName[k] == 'l' )
                CountCur++;
            else
                break;
        CountMax = Abc_MaxInt( CountMax, CountCur );
    }
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        CountCur = 0;
        pName = Abc_ObjName(pObj);
        for ( k = 0; pName[k]; k++ )
            if ( pName[k] == 'l' )
                CountCur++;
            else
                break;
        CountMax = Abc_MaxInt( CountMax, CountCur );
    }
//printf( "CountMax = %d\n", CountMax );
    assert( CountMax < 100-2 );
    for ( i = 0; i <= CountMax; i++ )
        PrefLi[i] = PrefLo[i] = 'l';
    PrefLi[i] = 'i';
    PrefLo[i] = 'o';
    PrefLi[i+1] = 0;
    PrefLo[i+1] = 0;
    // create latch names
    assert( !Abc_NtkIsNetlist(pNtk) );
    nDigits = Abc_Base10Log( Abc_NtkLatchNum(pNtk) );
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        Abc_ObjAssignName( pObj, Abc_ObjNameDummy("l", i, nDigits), NULL );
        Abc_ObjAssignName( Abc_ObjFanin0(pObj),  Abc_ObjNameDummy(PrefLi, i, nDigits), NULL );
        Abc_ObjAssignName( Abc_ObjFanout0(pObj), Abc_ObjNameDummy(PrefLo, i, nDigits), NULL );
    }
/*
    nDigits = Abc_Base10Log( Abc_NtkBlackboxNum(pNtk) );
    Abc_NtkForEachBlackbox( pNtk, pObj, i )
    {
        pName = Abc_ObjAssignName( pObj, Abc_ObjNameDummy("B", i, nDigits), NULL );
        nDigitsF = Abc_Base10Log( Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Abc_ObjAssignName( Abc_ObjFanin0(pObj), pName, Abc_ObjNameDummy("i", k, nDigitsF) );
        nDigitsF = Abc_Base10Log( Abc_ObjFanoutNum(pObj) );
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_ObjAssignName( Abc_ObjFanin0(pObj), pName, Abc_ObjNameDummy("o", k, nDigitsF) );
    }
*/
}